

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.cpp
# Opt level: O1

R_conflict6 * parse_scope(R_conflict6 *__return_storage_ptr__,QByteArrayView qualifiedKey)

{
  bool bVar1;
  qsizetype qVar2;
  storage_type *psVar3;
  long from;
  QByteArrayView needle;
  QByteArrayView haystack;
  QByteArrayView needle_00;
  
  psVar3 = qualifiedKey.m_data;
  from = qualifiedKey.m_size;
  needle.m_data = "QFlags<";
  needle.m_size = 7;
  bVar1 = QtPrivate::startsWith(qualifiedKey,needle);
  if ((from != 0 && bVar1) && (psVar3[from + -1] == '>')) {
    from = from + -8;
    psVar3 = psVar3 + 7;
  }
  haystack.m_data = psVar3;
  haystack.m_size = from;
  needle_00.m_data = "::";
  needle_00.m_size = 2;
  qVar2 = QtPrivate::lastIndexOf(haystack,from,needle_00);
  if (qVar2 < 0) {
    (__return_storage_ptr__->scope).super__Optional_base<QByteArrayView,_true,_true>._M_payload.
    super__Optional_payload_base<QByteArrayView>._M_engaged = false;
  }
  else {
    (__return_storage_ptr__->scope).super__Optional_base<QByteArrayView,_true,_true>._M_payload.
    super__Optional_payload_base<QByteArrayView>._M_payload._M_value.m_size = qVar2;
    (__return_storage_ptr__->scope).super__Optional_base<QByteArrayView,_true,_true>._M_payload.
    super__Optional_payload_base<QByteArrayView>._M_payload._M_value.m_data = psVar3;
    (__return_storage_ptr__->scope).super__Optional_base<QByteArrayView,_true,_true>._M_payload.
    super__Optional_payload_base<QByteArrayView>._M_engaged = true;
    psVar3 = psVar3 + qVar2 + 2;
    from = from - (qVar2 + 2);
  }
  (__return_storage_ptr__->key).m_size = from;
  (__return_storage_ptr__->key).m_data = psVar3;
  return __return_storage_ptr__;
}

Assistant:

static auto parse_scope(QByteArrayView qualifiedKey) noexcept
{
    struct R {
        std::optional<QByteArrayView> scope;
        QByteArrayView key;
    };
    if (qualifiedKey.startsWith("QFlags<") && qualifiedKey.endsWith('>'))
        qualifiedKey.slice(7, qualifiedKey.length() - 8);
    const auto scopePos = qualifiedKey.lastIndexOf("::"_L1);
    if (scopePos < 0)
        return R{std::nullopt, qualifiedKey};
    else
        return R{qualifiedKey.first(scopePos), qualifiedKey.sliced(scopePos + 2)};
}